

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O1

void ** CP_consolidateDataToRankZero
                  (SstStream Stream,void *LocalInfo,FFSTypeHandle Type,void **RetDataBlock)

{
  int iVar1;
  FFSContext p_Var2;
  size_t sVar3;
  uint uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  void *sendbuf;
  size_t *recvcounts;
  size_t *displs;
  void *recvbuf;
  void **ppvVar7;
  long lVar8;
  void **ppvVar9;
  long lVar10;
  size_t DataSize;
  size_t *local_38;
  
  uVar5 = create_FFSBuffer();
  uVar6 = FMFormat_of_original(Type);
  sendbuf = (void *)FFSencode(uVar5,uVar6,LocalInfo,&DataSize);
  if (Stream->Rank == 0) {
    recvcounts = (size_t *)malloc((long)Stream->CohortSize << 3);
  }
  else {
    recvcounts = (size_t *)0x0;
  }
  SMPI_Gather(&DataSize,1,SMPI_SIZE_T,recvcounts,1,SMPI_SIZE_T,0,Stream->mpiComm);
  if (Stream->Rank == 0) {
    lVar10 = (long)Stream->CohortSize;
    displs = (size_t *)malloc(lVar10 * 8);
    *displs = 0;
    uVar4 = (int)*recvcounts + 7U & 0xfffffff8;
    if (1 < lVar10) {
      lVar8 = 1;
      do {
        sVar3 = recvcounts[lVar8];
        displs[lVar8] = (long)(int)uVar4;
        uVar4 = uVar4 + ((int)sVar3 + 7U & 0xfffffff8);
        lVar8 = lVar8 + 1;
      } while (lVar10 != lVar8);
    }
    recvbuf = malloc((long)(int)uVar4);
  }
  else {
    displs = (size_t *)0x0;
    recvbuf = (void *)0x0;
  }
  SMPI_Gatherv(sendbuf,(int)DataSize,SMPI_CHAR,recvbuf,recvcounts,displs,SMPI_CHAR,0,Stream->mpiComm
              );
  free_FFSBuffer(uVar5);
  if (Stream->Rank == 0) {
    p_Var2 = Stream->CPInfo->ffs_c;
    iVar1 = Stream->CohortSize;
    local_38 = recvcounts;
    ppvVar7 = (void **)malloc((long)iVar1 * 8);
    if (0 < (long)iVar1) {
      lVar10 = 0;
      ppvVar9 = ppvVar7;
      do {
        FFSdecode_in_place(p_Var2,displs[lVar10] + (long)recvbuf,ppvVar9);
        lVar10 = lVar10 + 1;
        ppvVar9 = ppvVar9 + 1;
      } while (lVar10 < Stream->CohortSize);
    }
    free(displs);
    free(local_38);
  }
  else {
    ppvVar7 = (void **)0x0;
  }
  *RetDataBlock = recvbuf;
  return ppvVar7;
}

Assistant:

void **CP_consolidateDataToRankZero(SstStream Stream, void *LocalInfo, FFSTypeHandle Type,
                                    void **RetDataBlock)
{
    FFSBuffer Buf = create_FFSBuffer();
    size_t DataSize;
    size_t *RecvCounts = NULL;
    char *Buffer;

    struct _CP_DP_init_info **Pointers = NULL;

    Buffer = FFSencode(Buf, FMFormat_of_original(Type), LocalInfo, &DataSize);

    if (Stream->Rank == 0)
    {
        RecvCounts = malloc(Stream->CohortSize * sizeof(*RecvCounts));
    }
    SMPI_Gather(&DataSize, 1, SMPI_SIZE_T, RecvCounts, 1, SMPI_SIZE_T, 0, Stream->mpiComm);

    /*
     * Figure out the total length of block
     * and displacements for each rank
     */

    size_t *Displs = NULL;
    char *RecvBuffer = NULL;

    if (Stream->Rank == 0)
    {
        int TotalLen = 0;
        Displs = malloc(Stream->CohortSize * sizeof(*Displs));

        Displs[0] = 0;
        TotalLen = (RecvCounts[0] + 7) & ~7;

        for (int i = 1; i < Stream->CohortSize; i++)
        {
            int RoundUp = (RecvCounts[i] + 7) & ~7;
            Displs[i] = TotalLen;
            TotalLen += RoundUp;
        }

        RecvBuffer = malloc(TotalLen * sizeof(char));
    }

    /*
     * Now we have the receive buffer, counts, and displacements, and
     * can gather the data
     */

    SMPI_Gatherv(Buffer, (int)DataSize, SMPI_CHAR, RecvBuffer, RecvCounts, Displs, SMPI_CHAR, 0,
                 Stream->mpiComm);
    free_FFSBuffer(Buf);

    if (Stream->Rank == 0)
    {
        FFSContext context = Stream->CPInfo->ffs_c;
        //        FFSTypeHandle ffs_type = FFSTypeHandle_from_encode(context,
        //        RecvBuffer);

        int i;
        Pointers = malloc(Stream->CohortSize * sizeof(Pointers[0]));
        for (i = 0; i < Stream->CohortSize; i++)
        {
            FFSdecode_in_place(context, RecvBuffer + Displs[i], (void **)&Pointers[i]);
            // printf("Decode for rank %d :\n", i);
            // FMdump_data(FMFormat_of_original(ffs_type), Pointers[i],
            // 1024000);
        }
        free(Displs);
        free(RecvCounts);
    }
    *RetDataBlock = RecvBuffer;
    return (void **)Pointers;
}